

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O2

iterator * __thiscall
pybind11::detail::values_and_holders::find
          (iterator *__return_storage_ptr__,values_and_holders *this,type_info *find_type)

{
  pointer pptVar1;
  pointer pptVar2;
  
  begin(__return_storage_ptr__,this);
  pptVar1 = (this->tinfo->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pptVar2 = (this->tinfo->
            super__Vector_base<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  while (((__return_storage_ptr__->curr).index != (long)pptVar1 - (long)pptVar2 >> 3 &&
         ((__return_storage_ptr__->curr).type != find_type))) {
    iterator::operator++(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

iterator find(const type_info *find_type) {
        auto it = begin(), endit = end();
        while (it != endit && it->type != find_type) ++it;
        return it;
    }